

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Driver.cpp
# Opt level: O2

bool __thiscall
irr::video::COpenGL3DriverBase::updateHardwareBuffer
          (COpenGL3DriverBase *this,SHWBufferLink *HWBuffer)

{
  bool bVar1;
  u32 uVar2;
  u32 uVar3;
  COpenGL3DriverBase *pCVar4;
  
  if (HWBuffer == (SHWBufferLink *)0x0) {
    return false;
  }
  if (HWBuffer->Mapped_Vertex == EHM_NEVER) {
LAB_0020c703:
    if (HWBuffer->Mapped_Index != EHM_NEVER) {
      uVar3 = HWBuffer->ChangedID_Index;
      uVar2 = (*HWBuffer->MeshBuffer->_vptr_IMeshBuffer[0x19])();
      if ((uVar3 != uVar2) || (*(int *)((long)&HWBuffer[1]._vptr_SHWBufferLink + 4) == 0)) {
        pCVar4 = (COpenGL3DriverBase *)HWBuffer->MeshBuffer;
        uVar3 = (*(pCVar4->super_CNullDriver).super_IVideoDriver._vptr_IVideoDriver[0x19])();
        HWBuffer->ChangedID_Index = uVar3;
        bVar1 = updateIndexHardwareBuffer(pCVar4,(SHWBufferLink_opengl *)HWBuffer);
        if (!bVar1) goto LAB_0020c746;
      }
    }
    bVar1 = true;
  }
  else {
    uVar3 = HWBuffer->ChangedID_Vertex;
    uVar2 = (*HWBuffer->MeshBuffer->_vptr_IMeshBuffer[0x18])();
    if ((uVar3 == uVar2) && (*(int *)&HWBuffer[1]._vptr_SHWBufferLink != 0)) goto LAB_0020c703;
    pCVar4 = (COpenGL3DriverBase *)HWBuffer->MeshBuffer;
    uVar3 = (*(pCVar4->super_CNullDriver).super_IVideoDriver._vptr_IVideoDriver[0x18])();
    HWBuffer->ChangedID_Vertex = uVar3;
    bVar1 = updateVertexHardwareBuffer(pCVar4,(SHWBufferLink_opengl *)HWBuffer);
    if (bVar1) goto LAB_0020c703;
LAB_0020c746:
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool COpenGL3DriverBase::updateHardwareBuffer(SHWBufferLink *HWBuffer)
{
	if (!HWBuffer)
		return false;

	if (HWBuffer->Mapped_Vertex != scene::EHM_NEVER) {
		if (HWBuffer->ChangedID_Vertex != HWBuffer->MeshBuffer->getChangedID_Vertex() || !static_cast<SHWBufferLink_opengl *>(HWBuffer)->vbo_verticesID) {

			HWBuffer->ChangedID_Vertex = HWBuffer->MeshBuffer->getChangedID_Vertex();

			if (!updateVertexHardwareBuffer(static_cast<SHWBufferLink_opengl *>(HWBuffer)))
				return false;
		}
	}

	if (HWBuffer->Mapped_Index != scene::EHM_NEVER) {
		if (HWBuffer->ChangedID_Index != HWBuffer->MeshBuffer->getChangedID_Index() || !static_cast<SHWBufferLink_opengl *>(HWBuffer)->vbo_indicesID) {

			HWBuffer->ChangedID_Index = HWBuffer->MeshBuffer->getChangedID_Index();

			if (!updateIndexHardwareBuffer((SHWBufferLink_opengl *)HWBuffer))
				return false;
		}
	}

	return true;
}